

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceC.cpp
# Opt level: O2

uint SoapySDRDevice_readGPIO(SoapySDRDevice *device,char *bank)

{
  uint uVar1;
  undefined1 *puVar2;
  allocator local_31;
  string local_30 [32];
  
  puVar2 = (undefined1 *)__tls_get_addr(&PTR_0014be88);
  *puVar2 = 0;
  *(undefined4 *)(puVar2 + 0x400) = 0;
  std::__cxx11::string::string(local_30,bank,&local_31);
  uVar1 = (**(code **)(*(long *)device + 0x378))(device,local_30);
  std::__cxx11::string::~string(local_30);
  return uVar1;
}

Assistant:

__SOAPY_SDR_C_CATCH
}

unsigned SoapySDRDevice_readGPIO(const SoapySDRDevice *device, const char *bank)
{
    __SOAPY_SDR_C_TRY
    return device->readGPIO(bank);
    __SOAPY_SDR_C_CATCH
}